

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var2;
  iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_f0;
  long *local_e0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d8;
  const_iterator local_d0;
  long *local_c0;
  long *local_b8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_b0;
  const_iterator local_a8;
  long *local_98;
  long *local_90;
  allocator<long> local_71;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_70;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_68;
  undefined1 local_60 [8];
  value_container_type buffer;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_28;
  undefined1 local_19;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  *piStack_18;
  bool is_sorted_and_unique;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *range_local;
  k_ary_search_set<long,_std::less<void>_> *this_local;
  
  piStack_18 = (iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                *)range;
  range_local = (iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 *)this;
  _Var1 = boost::iterator_range_detail::
          iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                   *)range);
  _Var2 = boost::iterator_range_detail::
          iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::end(piStack_18);
  not_fn<std::less<void>&>((less<void> *)(this + 0x20));
  local_28 = std::
             adjacent_find<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,burst::not_fn_t<std::less<void>>>
                       (_Var1._M_current,_Var2._M_current);
  buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)boost::iterator_range_detail::
                iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                ::end(piStack_18);
  local_19 = __gnu_cxx::operator==
                       (&local_28,
                        (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                         *)&buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  if ((bool)local_19) {
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
              (this,(iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                     *)piStack_18);
  }
  else {
    local_68 = boost::iterator_range_detail::
               iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
               ::begin(piStack_18);
    local_70 = boost::iterator_range_detail::
               iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
               ::end(piStack_18);
    std::allocator<long>::allocator(&local_71);
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,void>
              ((vector<long,std::allocator<long>> *)local_60,local_68,local_70,&local_71);
    std::allocator<long>::~allocator(&local_71);
    local_90 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                 ((vector<long,_std::allocator<long>_> *)local_60);
    local_98 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)local_60);
    std::
    sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::less<void>>
              (local_90,local_98);
    local_b8 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                 ((vector<long,_std::allocator<long>_> *)local_60);
    local_c0 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)local_60);
    not_fn<std::less<void>&>((less<void> *)(this + 0x20));
    local_b0 = std::
               unique<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::not_fn_t<std::less<void>>>
                         (local_b8,local_c0);
    __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
    __normal_iterator<long*>
              ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_a8,
               &local_b0);
    local_d8._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::end
                           ((vector<long,_std::allocator<long>_> *)local_60);
    __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
    __normal_iterator<long*>
              ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_d0,
               &local_d8);
    local_e0 = (long *)std::vector<long,_std::allocator<long>_>::erase
                                 ((vector<long,_std::allocator<long>_> *)local_60,local_a8,local_d0)
    ;
    local_f0 = (iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                )boost::make_iterator_range<std::vector<long,std::allocator<long>>>
                           ((vector<long,_std::allocator<long>_> *)local_60);
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
              (this,(iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                     *)&local_f0);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_60);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }